

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int tinyexr::DecodeEXRImage
              (EXRImage *exr_image,EXRHeader *exr_header,uchar *head,uchar *marker,size_t size,
              char **err)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  reference this;
  reference pvVar5;
  ulong uVar6;
  undefined8 *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  uchar *in_R8;
  int ret_2;
  string e;
  bool ret_1;
  size_t y_1;
  tinyexr_uint64 offset;
  size_t y;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *offsets;
  int ret;
  vector<int,_std::allocator<int>_> num_y_tiles;
  vector<int,_std::allocator<int>_> num_x_tiles;
  size_t num_blocks;
  OffsetData offset_data;
  int data_height;
  int data_width;
  int num_scanline_blocks;
  string *in_stack_00000740;
  size_t in_stack_00000748;
  uchar *in_stack_00000750;
  OffsetData *in_stack_00000758;
  EXRHeader *in_stack_00000760;
  EXRImage *in_stack_00000768;
  uint in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffc9c;
  string *in_stack_fffffffffffffca0;
  EXRImage *exr_image_00;
  undefined4 in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb4;
  OffsetData *in_stack_fffffffffffffcb8;
  allocator *paVar7;
  undefined7 in_stack_fffffffffffffcc0;
  undefined1 in_stack_fffffffffffffcc7;
  uchar *in_stack_fffffffffffffcc8;
  size_t in_stack_fffffffffffffcd0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffcd8;
  vector<int,_std::allocator<int>_> *num_y_tiles_00;
  vector<int,_std::allocator<int>_> *num_x_tiles_00;
  EXRHeader *in_stack_fffffffffffffd08;
  undefined2 uVar8;
  OffsetData *in_stack_fffffffffffffd10;
  uchar *in_stack_fffffffffffffd18;
  uchar *in_stack_fffffffffffffd20;
  EXRHeader *in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd30;
  char **in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd40;
  uchar **in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd54;
  EXRTile *in_stack_fffffffffffffd58;
  allocator local_281;
  string local_280 [39];
  undefined1 local_259;
  ulong local_258;
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [32];
  uchar *local_200;
  ulong local_1f8;
  reference local_1f0;
  int local_1e4;
  int local_1e0;
  allocator local_1d9;
  string local_1d8 [32];
  vector<int,_std::allocator<int>_> local_1b8;
  vector<int,_std::allocator<int>_> local_1a0;
  ulong local_188;
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_180;
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [32];
  int local_c0;
  allocator local_b9;
  string local_b8 [32];
  int local_98;
  allocator local_91;
  string local_90 [32];
  int local_70;
  allocator local_59;
  string local_58 [40];
  uchar *local_30;
  undefined8 *local_28;
  long local_20;
  long local_18;
  int local_4;
  
  if ((((in_RDI == 0) || (in_RSI == 0)) || (in_RDX == 0)) ||
     ((in_RCX == (undefined8 *)0x0 || (in_R8 < (uchar *)0x9)))) {
    paVar7 = &local_59;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"Invalid argument for DecodeEXRImage().",paVar7);
    SetErrorMessage(in_stack_fffffffffffffca0,
                    (char **)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    return -3;
  }
  local_70 = 1;
  if (*(int *)(in_RSI + 0x7c) == 3) {
    local_70 = 0x10;
  }
  else if (*(int *)(in_RSI + 0x7c) == 4) {
    local_70 = 0x20;
  }
  else if (*(int *)(in_RSI + 0x7c) == 0x80) {
    local_70 = 0x10;
  }
  if (*(int *)(in_RSI + 0x10) < *(int *)(in_RSI + 8)) {
LAB_00446c36:
    paVar7 = &local_91;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"Invalid data width value",paVar7);
    SetErrorMessage(in_stack_fffffffffffffca0,
                    (char **)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    return -4;
  }
  iVar2 = *(int *)(in_RSI + 0x10) - *(int *)(in_RSI + 8);
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  iVar3 = std::numeric_limits<int>::max();
  if (iVar2 == iVar3) goto LAB_00446c36;
  local_98 = (*(int *)(local_18 + 0x10) - *(int *)(local_18 + 8)) + 1;
  if (*(int *)(local_18 + 0x14) < *(int *)(local_18 + 0xc)) {
LAB_00446d39:
    paVar7 = &local_b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"Invalid data height value",paVar7);
    SetErrorMessage(in_stack_fffffffffffffca0,
                    (char **)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    return -4;
  }
  iVar3 = *(int *)(local_18 + 0x14) - *(int *)(local_18 + 0xc);
  iVar4 = std::numeric_limits<int>::max();
  if (iVar3 == iVar4) goto LAB_00446d39;
  local_c0 = (*(int *)(local_18 + 0x14) - *(int *)(local_18 + 0xc)) + 1;
  if (0x800000 < local_98) {
    paVar7 = &local_e1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,"data width too large.",paVar7);
    SetErrorMessage(in_stack_fffffffffffffca0,
                    (char **)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    return -4;
  }
  if (0x800000 < local_c0) {
    paVar7 = &local_109;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"data height too large.",paVar7);
    SetErrorMessage(in_stack_fffffffffffffca0,
                    (char **)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    return -4;
  }
  if (*(int *)(local_18 + 0x38) != 0) {
    if (0x800000 < *(int *)(local_18 + 0x3c)) {
      paVar7 = &local_131;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_130,"tile width too large.",paVar7);
      SetErrorMessage(in_stack_fffffffffffffca0,
                      (char **)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
      std::__cxx11::string::~string(local_130);
      std::allocator<char>::~allocator((allocator<char> *)&local_131);
      return -4;
    }
    if (0x800000 < *(int *)(local_18 + 0x40)) {
      paVar7 = &local_159;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_158,"tile height too large.",paVar7);
      SetErrorMessage(in_stack_fffffffffffffca0,
                      (char **)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
      std::__cxx11::string::~string(local_158);
      std::allocator<char>::~allocator((allocator<char> *)&local_159);
      return -4;
    }
  }
  OffsetData::OffsetData((OffsetData *)in_stack_fffffffffffffca0);
  local_188 = 0;
  if (*(int *)(local_18 + 0x38) == 0) {
    if (*(int *)(local_18 + 0x34) < 1) {
      local_188 = (ulong)(long)local_c0 / (ulong)(long)local_70;
      if (local_188 * (long)local_70 < (ulong)(long)local_c0) {
        local_188 = local_188 + 1;
      }
      InitSingleResolutionOffsets
                ((OffsetData *)in_stack_fffffffffffffca0,
                 CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    }
    else {
      local_188 = (ulong)*(int *)(local_18 + 0x34);
      InitSingleResolutionOffsets
                ((OffsetData *)in_stack_fffffffffffffca0,
                 CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    }
  }
  else {
    num_y_tiles_00 = &local_1a0;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x4470e2);
    num_x_tiles_00 = &local_1b8;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x4470f4);
    PrecalculateTileInfo
              ((vector<int,_std::allocator<int>_> *)
               CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0),
               (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcb8,
               (EXRHeader *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
    iVar4 = InitTileOffsets(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,num_x_tiles_00,
                            num_y_tiles_00);
    uVar8 = (undefined2)((ulong)in_stack_fffffffffffffd08 >> 0x30);
    local_188 = (ulong)iVar4;
    if ((*(int *)(local_18 + 0x34) < 1) || (*(int *)(local_18 + 0x34) == iVar4)) {
      local_1e0 = 0;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1d8,"Invalid offset table size.",&local_1d9);
      SetErrorMessage(in_stack_fffffffffffffca0,
                      (char **)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
      std::__cxx11::string::~string(local_1d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
      local_4 = -4;
      local_1e0 = 1;
    }
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
    if (local_1e0 != 0) goto LAB_00447888;
    local_1e4 = ReadOffsets((OffsetData *)in_stack_fffffffffffffd58,
                            (uchar *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                            in_stack_fffffffffffffd48,CONCAT44(iVar2,in_stack_fffffffffffffd40),
                            in_stack_fffffffffffffd38);
    if (local_1e4 != 0) {
      local_1e0 = 1;
      local_4 = local_1e4;
      goto LAB_00447888;
    }
    bVar1 = IsAnyOffsetsAreInvalid(in_stack_fffffffffffffcb8);
    if (bVar1) {
      in_stack_fffffffffffffc98 = (uint)(*(int *)(local_18 + 0x50) != 0);
      ReconstructTileOffsets
                ((OffsetData *)CONCAT44(iVar3,in_stack_fffffffffffffd30),in_stack_fffffffffffffd28,
                 in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                 (size_t)in_stack_fffffffffffffd10,SUB21((ushort)uVar8 >> 8,0),SUB21(uVar8,0));
    }
  }
  if (*(int *)(local_18 + 0x38) == 0) {
    this = std::
           vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
           ::operator[](&local_180,0);
    local_1f0 = std::
                vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ::operator[](this,0);
    for (local_1f8 = 0; local_1f8 < local_188; local_1f8 = local_1f8 + 1) {
      if (local_30 + local_20 <= local_28 + 1) {
        paVar7 = &local_221;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_220,"Insufficient data size in offset table.",paVar7);
        SetErrorMessage(in_stack_fffffffffffffca0,
                        (char **)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
        std::__cxx11::string::~string(local_220);
        std::allocator<char>::~allocator((allocator<char> *)&local_221);
        local_4 = -4;
        local_1e0 = 1;
        goto LAB_00447888;
      }
      local_200 = (uchar *)*local_28;
      swap8((tinyexr_uint64 *)&local_200);
      if (local_30 <= local_200) {
        paVar7 = &local_249;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_248,"Invalid offset value in DecodeEXRImage.",paVar7);
        SetErrorMessage(in_stack_fffffffffffffca0,
                        (char **)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
        std::__cxx11::string::~string(local_248);
        std::allocator<char>::~allocator((allocator<char> *)&local_249);
        local_4 = -4;
        local_1e0 = 1;
        goto LAB_00447888;
      }
      local_28 = local_28 + 1;
      in_stack_fffffffffffffcc8 = local_200;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (local_1f0,local_1f8);
      *pvVar5 = (value_type)in_stack_fffffffffffffcc8;
    }
    for (local_258 = 0; local_258 < local_188; local_258 = local_258 + 1) {
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (local_1f0,local_258);
      if (*pvVar5 == 0) {
        local_259 = ReconstructLineOffsets
                              (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
                               in_stack_fffffffffffffcc8,
                               (uchar *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0
                                                ),(size_t)in_stack_fffffffffffffcb8);
        if (!(bool)local_259) {
          paVar7 = &local_281;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_280,"Cannot reconstruct lineOffset table in DecodeEXRImage.",paVar7);
          SetErrorMessage(in_stack_fffffffffffffca0,
                          (char **)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
          std::__cxx11::string::~string(local_280);
          std::allocator<char>::~allocator((allocator<char> *)&local_281);
          local_4 = -4;
          local_1e0 = 1;
          goto LAB_00447888;
        }
        break;
      }
    }
  }
  exr_image_00 = (EXRImage *)&stack0xfffffffffffffd58;
  std::__cxx11::string::string((string *)exr_image_00);
  iVar2 = DecodeChunk(in_stack_00000768,in_stack_00000760,in_stack_00000758,in_stack_00000750,
                      in_stack_00000748,in_stack_00000740);
  if (iVar2 != 0) {
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      SetErrorMessage(in_stack_fffffffffffffca0,
                      (char **)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    }
    FreeEXRImage(exr_image_00);
  }
  local_1e0 = 1;
  local_4 = iVar2;
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffd58);
LAB_00447888:
  OffsetData::~OffsetData((OffsetData *)0x447895);
  return local_4;
}

Assistant:

static int DecodeEXRImage(EXRImage *exr_image, const EXRHeader *exr_header,
                          const unsigned char *head,
                          const unsigned char *marker, const size_t size,
                          const char **err) {
  if (exr_image == NULL || exr_header == NULL || head == NULL ||
      marker == NULL || (size <= tinyexr::kEXRVersionSize)) {
    tinyexr::SetErrorMessage("Invalid argument for DecodeEXRImage().", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  int num_scanline_blocks = 1;
  if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZIP) {
    num_scanline_blocks = 16;
  } else if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {
    num_scanline_blocks = 32;
  } else if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
    num_scanline_blocks = 16;
  }

  if (exr_header->data_window.max_x < exr_header->data_window.min_x ||
      exr_header->data_window.max_x - exr_header->data_window.min_x ==
          std::numeric_limits<int>::max()) {
    // Issue 63
    tinyexr::SetErrorMessage("Invalid data width value", err);
    return TINYEXR_ERROR_INVALID_DATA;
  }
  int data_width =
      exr_header->data_window.max_x - exr_header->data_window.min_x + 1;

  if (exr_header->data_window.max_y < exr_header->data_window.min_y ||
      exr_header->data_window.max_y - exr_header->data_window.min_y ==
          std::numeric_limits<int>::max()) {
    tinyexr::SetErrorMessage("Invalid data height value", err);
    return TINYEXR_ERROR_INVALID_DATA;
  }
  int data_height =
      exr_header->data_window.max_y - exr_header->data_window.min_y + 1;

  // Do not allow too large data_width and data_height. header invalid?
  {
    if (data_width > TINYEXR_DIMENSION_THRESHOLD) {
      tinyexr::SetErrorMessage("data width too large.", err);
      return TINYEXR_ERROR_INVALID_DATA;
    }
    if (data_height > TINYEXR_DIMENSION_THRESHOLD) {
      tinyexr::SetErrorMessage("data height too large.", err);
      return TINYEXR_ERROR_INVALID_DATA;
    }
  }

  if (exr_header->tiled) {
    if (exr_header->tile_size_x > TINYEXR_DIMENSION_THRESHOLD) {
      tinyexr::SetErrorMessage("tile width too large.", err);
      return TINYEXR_ERROR_INVALID_DATA;
    }
    if (exr_header->tile_size_y > TINYEXR_DIMENSION_THRESHOLD) {
      tinyexr::SetErrorMessage("tile height too large.", err);
      return TINYEXR_ERROR_INVALID_DATA;
    }
  }

  // Read offset tables.
  OffsetData offset_data;
  size_t num_blocks = 0;
  // For a multi-resolution image, the size of the offset table will be calculated from the other attributes of the header.
  // If chunk_count > 0 then chunk_count must be equal to the calculated tile count.
  if (exr_header->tiled) {
    {
      std::vector<int> num_x_tiles, num_y_tiles;
      PrecalculateTileInfo(num_x_tiles, num_y_tiles, exr_header);
      num_blocks = size_t(InitTileOffsets(offset_data, exr_header, num_x_tiles, num_y_tiles));
      if (exr_header->chunk_count > 0) {
        if (exr_header->chunk_count != static_cast<int>(num_blocks)) {
          tinyexr::SetErrorMessage("Invalid offset table size.", err);
          return TINYEXR_ERROR_INVALID_DATA;
        }
      }
    }

    int ret = ReadOffsets(offset_data, head, marker, size, err);
    if (ret != TINYEXR_SUCCESS) return ret;
    if (IsAnyOffsetsAreInvalid(offset_data)) {
      ReconstructTileOffsets(offset_data, exr_header,
        head, marker, size,
        exr_header->multipart, exr_header->non_image);
    }
  } else if (exr_header->chunk_count > 0) {
    // Use `chunkCount` attribute.
    num_blocks = static_cast<size_t>(exr_header->chunk_count);
    InitSingleResolutionOffsets(offset_data, num_blocks);
  } else {
    num_blocks = static_cast<size_t>(data_height) /
      static_cast<size_t>(num_scanline_blocks);
    if (num_blocks * static_cast<size_t>(num_scanline_blocks) <
      static_cast<size_t>(data_height)) {
      num_blocks++;
    }

    InitSingleResolutionOffsets(offset_data, num_blocks);
  }

  if (!exr_header->tiled) {
    std::vector<tinyexr::tinyexr_uint64>& offsets = offset_data.offsets[0][0];
    for (size_t y = 0; y < num_blocks; y++) {
      tinyexr::tinyexr_uint64 offset;
      // Issue #81
      if ((marker + sizeof(tinyexr_uint64)) >= (head + size)) {
        tinyexr::SetErrorMessage("Insufficient data size in offset table.", err);
        return TINYEXR_ERROR_INVALID_DATA;
      }

      memcpy(&offset, marker, sizeof(tinyexr::tinyexr_uint64));
      tinyexr::swap8(&offset);
      if (offset >= size) {
        tinyexr::SetErrorMessage("Invalid offset value in DecodeEXRImage.", err);
        return TINYEXR_ERROR_INVALID_DATA;
      }
      marker += sizeof(tinyexr::tinyexr_uint64);  // = 8
      offsets[y] = offset;
    }

    // If line offsets are invalid, we try to reconstruct it.
    // See OpenEXR/IlmImf/ImfScanLineInputFile.cpp::readLineOffsets() for details.
    for (size_t y = 0; y < num_blocks; y++) {
      if (offsets[y] <= 0) {
        // TODO(syoyo) Report as warning?
        // if (err) {
        //  stringstream ss;
        //  ss << "Incomplete lineOffsets." << std::endl;
        //  (*err) += ss.str();
        //}
        bool ret =
          ReconstructLineOffsets(&offsets, num_blocks, head, marker, size);
        if (ret) {
          // OK
          break;
        } else {
          tinyexr::SetErrorMessage(
            "Cannot reconstruct lineOffset table in DecodeEXRImage.", err);
          return TINYEXR_ERROR_INVALID_DATA;
        }
      }
    }
  }

  {
    std::string e;
    int ret = DecodeChunk(exr_image, exr_header, offset_data, head, size, &e);

    if (ret != TINYEXR_SUCCESS) {
      if (!e.empty()) {
        tinyexr::SetErrorMessage(e, err);
      }

#if 1
      FreeEXRImage(exr_image);
#else
      // release memory(if exists)
      if ((exr_header->num_channels > 0) && exr_image && exr_image->images) {
        for (size_t c = 0; c < size_t(exr_header->num_channels); c++) {
          if (exr_image->images[c]) {
            free(exr_image->images[c]);
            exr_image->images[c] = NULL;
          }
        }
        free(exr_image->images);
        exr_image->images = NULL;
      }
#endif
    }

    return ret;
  }
}